

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cc
# Opt level: O2

void __thiscall gimage::BasicImageIO::loadProperties(BasicImageIO *this,Properties *prop,char *name)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  string s;
  ifstream in;
  uint auStack_208 [122];
  
  std::__cxx11::string::string((string *)&s,name,(allocator *)&in);
  uVar3 = std::__cxx11::string::rfind((char)&s,0x3a);
  if (uVar3 == 0xffffffffffffffff) {
LAB_0012bda6:
    std::__cxx11::string::assign((char *)&s);
    lVar4 = std::__cxx11::string::rfind((char)&s,0x2e);
    if (lVar4 != -1) {
      std::__cxx11::string::substr((ulong)&in,(ulong)&s);
      std::__cxx11::string::operator=((string *)&s,(string *)&in);
      std::__cxx11::string::~string((string *)&in);
    }
    std::ifstream::ifstream(&in);
    std::operator+(&local_268,&s,".hdr");
    std::ifstream::open((char *)&in,(_Ios_Openmode)local_268._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_268);
    if ((*(byte *)((long)auStack_208 + *(long *)(_in + -0x18)) & 5) == 0) {
      gutil::Properties::load(prop,(istream *)&in);
      std::ifstream::close();
    }
    std::operator+(&local_268,&s,"_param.txt");
    std::ifstream::open((char *)&in,(_Ios_Openmode)local_268._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_268);
    if ((*(byte *)((long)auStack_208 + *(long *)(_in + -0x18)) & 5) == 0) {
      gutil::Properties::load(prop,(istream *)&in);
      std::ifstream::close();
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((ulong)&s,uVar3,(char *)0x2);
    if (iVar2 == 0) goto LAB_0012bda6;
    std::__cxx11::string::substr((ulong)&in,(ulong)&s);
    std::__cxx11::string::operator=((string *)&s,(string *)&in);
    std::__cxx11::string::~string((string *)&in);
    std::ifstream::ifstream(&in);
    std::operator+(&local_268,&s,".hdr");
    std::ifstream::open((char *)&in,(_Ios_Openmode)local_268._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_268);
    uVar1 = *(uint *)((long)auStack_208 + *(long *)(_in + -0x18));
    if ((uVar1 & 5) == 0) {
      gutil::Properties::load(prop,(istream *)&in);
      std::ifstream::close();
    }
    std::operator+(&local_268,&s,"_param.txt");
    std::ifstream::open((char *)&in,(_Ios_Openmode)local_268._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_268);
    if ((*(byte *)((long)auStack_208 + *(long *)(_in + -0x18)) & 5) != 0) {
      std::ifstream::~ifstream(&in);
      if ((uVar1 & 5) == 0) goto LAB_0012becc;
      goto LAB_0012bda6;
    }
    gutil::Properties::load(prop,(istream *)&in);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&in);
LAB_0012becc:
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void BasicImageIO::loadProperties(gutil::Properties &prop, const char *name) const
{
  std::string s=name;
  size_t pos;
  bool available=false;

  pos=s.rfind(':');

  if (pos != s.npos && s.compare(pos, 2, ":\\") == 0)
  {
    pos=s.npos;
  }

  if (pos != s.npos)
  {
    // try loading as tiled image

    s=s.substr(0, pos);

    std::ifstream in;
    in.open((s+".hdr").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      available=true;
      prop.load(in);
      in.close();
    }

    in.open((s+"_param.txt").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      available=true;
      prop.load(in);
      in.close();
    }
  }

  if (!available)
  {
    // loading as normal image

    s=name;
    pos=s.rfind('.');

    if (pos != s.npos)
    {
      s=s.substr(0, pos);
    }

    std::ifstream in;
    in.open((s+".hdr").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      prop.load(in);
      in.close();
    }

    in.open((s+"_param.txt").c_str(), std::ifstream::in);

    if (!in.fail())
    {
      prop.load(in);
      in.close();
    }
  }
}